

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bipgraph.h
# Opt level: O1

void __thiscall
libDAI::BipartiteGraph<libDAI::Var,_libDAI::TFactor<double>_>::Regenerate
          (BipartiteGraph<libDAI::Var,_libDAI::TFactor<double>_> *this)

{
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *pvVar1;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *this_00;
  vector<unsigned_long,std::allocator<unsigned_long>> *pvVar2;
  iterator iVar3;
  pointer pvVar4;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var5;
  long lVar6;
  unsigned_long *puVar7;
  ulong uVar8;
  long lVar9;
  pointer ppVar10;
  long lVar11;
  vector<unsigned_long,_std::allocator<unsigned_long>_> col;
  allocator_type local_51;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_50;
  value_type_conflict2 local_38;
  
  pvVar1 = &this->_nb1;
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::_M_erase_at_end(pvVar1,(this->_nb1).
                           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::resize(pvVar1,(long)(this->_V1).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->_V1).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 4);
  this_00 = &this->_nb2;
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::_M_erase_at_end(this_00,(this->_nb2).
                            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::resize(this_00,((long)(this->_V2).
                          super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->_V2).
                          super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7);
  ppVar10 = (this->_E12).
            super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppVar10 !=
      (this->_E12).
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    puVar7 = &ppVar10->second;
    do {
      pvVar2 = (vector<unsigned_long,std::allocator<unsigned_long>> *)
               ((pvVar1->
                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start +
               ((pair<unsigned_long,_unsigned_long> *)(puVar7 + -1))->first);
      iVar3._M_current = *(unsigned_long **)(pvVar2 + 8);
      if (iVar3._M_current == *(unsigned_long **)(pvVar2 + 0x10)) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>(pvVar2,iVar3,puVar7);
      }
      else {
        *iVar3._M_current = *puVar7;
        *(unsigned_long **)(pvVar2 + 8) = iVar3._M_current + 1;
      }
      pvVar2 = (vector<unsigned_long,std::allocator<unsigned_long>> *)
               ((this_00->
                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start + *puVar7);
      iVar3._M_current = *(unsigned_long **)(pvVar2 + 8);
      if (iVar3._M_current == *(unsigned_long **)(pvVar2 + 0x10)) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>(pvVar2,iVar3,puVar7 + -1);
      }
      else {
        *iVar3._M_current = ((pair<unsigned_long,_unsigned_long> *)(puVar7 + -1))->first;
        *(unsigned_long **)(pvVar2 + 8) = iVar3._M_current + 1;
      }
      ppVar10 = (pointer)(puVar7 + 1);
      puVar7 = puVar7 + 2;
    } while (ppVar10 !=
             (this->_E12).
             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  if ((this->_V1).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->_V1).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
      super__Vector_impl_data._M_start) {
    lVar11 = 8;
    uVar8 = 0;
    do {
      pvVar4 = (pvVar1->
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      _Var5 = std::
              __unique<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                        (*(undefined8 *)((long)pvVar4 + lVar11 + -8),
                         *(undefined8 *)
                          ((long)&(pvVar4->
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                                  ._M_impl.super__Vector_impl_data + lVar11));
      pvVar4 = (pvVar1->
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      puVar7 = *(unsigned_long **)
                ((long)&(pvVar4->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                        _M_impl.super__Vector_impl_data + lVar11);
      if ((_Var5._M_current != puVar7) &&
         (lVar9 = *(long *)((long)&(pvVar4->
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   )._M_impl.super__Vector_impl_data + lVar11),
         lVar6 = (long)_Var5._M_current + (lVar9 - (long)puVar7), lVar9 != lVar6)) {
        *(long *)((long)&(pvVar4->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                         ._M_impl.super__Vector_impl_data + lVar11) = lVar6;
      }
      uVar8 = uVar8 + 1;
      lVar11 = lVar11 + 0x18;
    } while (uVar8 < (ulong)((long)(this->_V1).
                                   super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->_V1).
                                   super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 4));
  }
  if ((this->_V2).
      super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>._M_impl
      .super__Vector_impl_data._M_finish !=
      (this->_V2).
      super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>._M_impl
      .super__Vector_impl_data._M_start) {
    lVar11 = 8;
    uVar8 = 0;
    do {
      pvVar4 = (this_00->
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      _Var5 = std::
              __unique<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                        (*(undefined8 *)((long)pvVar4 + lVar11 + -8),
                         *(undefined8 *)
                          ((long)&(pvVar4->
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                                  ._M_impl.super__Vector_impl_data + lVar11));
      pvVar4 = (this_00->
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      puVar7 = *(unsigned_long **)
                ((long)&(pvVar4->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                        _M_impl.super__Vector_impl_data + lVar11);
      if ((_Var5._M_current != puVar7) &&
         (lVar9 = *(long *)((long)&(pvVar4->
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   )._M_impl.super__Vector_impl_data + lVar11),
         lVar6 = (long)_Var5._M_current + (lVar9 - (long)puVar7), lVar9 != lVar6)) {
        *(long *)((long)&(pvVar4->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                         ._M_impl.super__Vector_impl_data + lVar11) = lVar6;
      }
      uVar8 = uVar8 + 1;
      lVar11 = lVar11 + 0x18;
    } while (uVar8 < (ulong)(((long)(this->_V2).
                                    super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->_V2).
                                    super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            0x6db6db6db6db6db7));
  }
  pvVar1 = &this->_E12ind;
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::_M_erase_at_end(pvVar1,(this->_E12ind).
                           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
  local_38 = 0xffffffffffffffff;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_50,
             ((long)(this->_V2).
                    super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->_V2).
                    super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7,&local_38,
             &local_51);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::_M_fill_assign(pvVar1,(long)(this->_V1).
                                super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->_V1).
                                super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                _M_impl.super__Vector_impl_data._M_start >> 4,&local_50);
  ppVar10 = (this->_E12).
            super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  lVar11 = (long)(this->_E12).
                 super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar10;
  if (lVar11 != 0) {
    lVar11 = lVar11 >> 4;
    pvVar4 = (pvVar1->
             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    puVar7 = &ppVar10->second;
    lVar9 = 0;
    do {
      *(long *)(*(long *)&pvVar4[((pair<unsigned_long,_unsigned_long> *)(puVar7 + -1))->first].
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data + *puVar7 * 8) = lVar9;
      lVar9 = lVar9 + 1;
      puVar7 = puVar7 + 2;
    } while (lVar11 + (ulong)(lVar11 == 0) != lVar9);
  }
  if (local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Regenerate() {
                // Calculate _nb1 and _nb2

                // Start with empty vectors
                _nb1.clear();
                _nb1.resize(_V1.size());
                // Start with empty vectors
                _nb2.clear();
                _nb2.resize(_V2.size());
                // Each edge yields a neighbour pair
                for( std::vector<edge_type>::const_iterator e = _E12.begin(); e != _E12.end(); e++ ) {
                    _nb1[e->first].push_back(e->second);
                    _nb2[e->second].push_back(e->first);
                }
                // Remove duplicates from _nb1
                for( size_t i1 = 0; i1 < _V1.size(); i1++ ) {
                    nb_type::iterator new_end = unique(_nb1[i1].begin(), _nb1[i1].end());
                    _nb1[i1].erase( new_end, _nb1[i1].end() );
                }
                // Remove duplicates from _nb2
                for( size_t i2 = 0; i2 < _V2.size(); i2++ ) {
                    nb_type::iterator new_end = unique(_nb2[i2].begin(), _nb2[i2].end());
                    _nb2[i2].erase( new_end, _nb2[i2].end() );
                }

                // Calculate _E12ind
                
                // Allocate data structures
                _E12ind.clear();
                std::vector<size_t> col(_V2.size(),-1);
                _E12ind.assign(_V1.size(), col);
                // Assign elements
                for( size_t k = 0; k < _E12.size(); k++ )
                    _E12ind[_E12[k].first][_E12[k].second] = k;
            }